

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O2

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalVarPower(WSNTopologyBasedEnergy *this)

{
  int iVar1;
  
  iVar1 = MinMark(this);
  switch(iVar1) {
  case 0:
    TopLayer0SentSink(this);
    return;
  case 1:
    TopLayer1SentSink(this);
    return;
  case 2:
    TopLayer2SentSink(this);
    return;
  case 3:
    TopLayer3SentSink(this);
    return;
  default:
    TopLayer4SentSink(this);
    return;
  }
}

Assistant:

void WSNTopologyBasedEnergy::NodeSentSignalVarPower()
{
	if(0==MinMark())
		TopLayer0SentSink();
	else if(1==MinMark())
		TopLayer1SentSink();
	else if(2==MinMark())
		TopLayer2SentSink();
	else if(3==MinMark())
		TopLayer3SentSink();
	else 
		TopLayer4SentSink();

	/*if(0==Mark[0])
	TopLayer0SentSink();
	else if(Mark[0]>=1&&0==Mark[1])
	TopLayer1SentSink();
	else if(Mark[0]>=1&&Mark[1]>=1&&0==Mark[2])
	TopLayer2SentSink();
	else if(Mark[0]>=1&&Mark[1]>=1&&Mark[2]>=1&& 0==Mark[3])
	TopLayer3SentSink();
	else 
	TopLayer4SentSink();*/
}